

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O3

bool __thiscall
slang::ast::anon_unknown_39::lookupUpward
          (anon_unknown_39 *this,
          span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>
          nameParts,NameComponents *name,ASTContext *context,bitmask<slang::ast::LookupFlags> flags,
          LookupResult *result)

{
  Symbol *this_00;
  size_t __n;
  LookupResult *this_01;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_00;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_01;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_02;
  bool bVar1;
  int iVar2;
  InstanceSymbol *pIVar3;
  Scope *pSVar4;
  DefinitionSymbol *pDVar5;
  Scope *this_02;
  __extent_storage<18446744073709551615UL> _Var6;
  __extent_storage<18446744073709551615UL> _Var7;
  bitmask<slang::ast::LookupFlags> flags_00;
  undefined4 in_register_0000008c;
  InstanceSymbol *pIVar8;
  uint32_t uVar9;
  
  _Var6 = nameParts._M_extent._M_extent_value;
  _Var7._M_extent_value = (size_t)nameParts._M_ptr;
  this_01 = (LookupResult *)CONCAT44(in_register_0000008c,flags.m_bits);
  flags_00.m_bits = (underlying_type)context;
  this_02 = (Scope *)(name->text)._M_len;
  pIVar8 = (InstanceSymbol *)0x0;
  uVar9 = 0;
  do {
    pIVar3 = (InstanceSymbol *)Scope::find(this_02,*(string_view *)_Var6._M_extent_value);
    if ((((pIVar3 != (InstanceSymbol *)0x0) && (bVar1 = Symbol::isValue((Symbol *)pIVar3), !bVar1))
        && (bVar1 = Symbol::isType((Symbol *)pIVar3), !bVar1)) &&
       ((pSVar4 = Symbol::scopeOrNull((Symbol *)pIVar3), pSVar4 != (Scope *)0x0 ||
        ((pIVar3->super_InstanceSymbolBase).super_Symbol.kind == Instance)))) {
      LookupResult::clear(this_01);
      this_01->found = (Symbol *)pIVar3;
      nameParts_00._M_extent._M_extent_value = _Var7._M_extent_value;
      nameParts_00._M_ptr = (pointer)this;
      bVar1 = lookupDownward(nameParts_00,*(NameComponents *)_Var6._M_extent_value,
                             (ASTContext *)name,flags_00,this_01);
      if (!bVar1) goto LAB_0032732e;
      if (pIVar8 == (InstanceSymbol *)0x0) {
        pIVar8 = pIVar3;
      }
      if (this_01->found == (Symbol *)0x0) goto LAB_0032722d;
LAB_00327332:
      this_01->upwardCount = uVar9;
      goto LAB_00327336;
    }
LAB_0032722d:
    this_00 = this_02->thisSym;
    if (this_00->kind == InstanceBody) {
      pIVar3 = (InstanceSymbol *)this_00[1].originatingSyntax;
      this_02 = (pIVar3->super_InstanceSymbolBase).super_Symbol.parentScope;
      pDVar5 = InstanceSymbol::getDefinition(pIVar3);
      __n = (pDVar5->super_Symbol).name._M_len;
      if ((__n == *(size_t *)_Var6._M_extent_value) &&
         ((__n == 0 ||
          (iVar2 = bcmp((pDVar5->super_Symbol).name._M_str,*(char **)(_Var6._M_extent_value + 8),__n
                       ), iVar2 == 0)))) {
        LookupResult::clear(this_01);
        this_01->found = (Symbol *)pIVar3;
        nameParts_01._M_extent._M_extent_value = _Var7._M_extent_value;
        nameParts_01._M_ptr = (pointer)this;
        bVar1 = lookupDownward(nameParts_01,*(NameComponents *)_Var6._M_extent_value,
                               (ASTContext *)name,flags_00,this_01);
        if (!bVar1) goto LAB_0032732e;
        if (pIVar8 == (InstanceSymbol *)0x0) {
          pIVar8 = pIVar3;
        }
        if (this_01->found != (Symbol *)0x0) goto LAB_00327332;
      }
    }
    else {
      this_02 = Symbol::getHierarchicalParent(this_00);
    }
    uVar9 = uVar9 + 1;
  } while (this_02 != (Scope *)0x0);
  LookupResult::clear(this_01);
  if (pIVar8 == (InstanceSymbol *)0x0) {
LAB_00327336:
    bVar1 = true;
  }
  else {
    this_01->found = (Symbol *)pIVar8;
    nameParts_02._M_extent._M_extent_value = _Var7._M_extent_value;
    nameParts_02._M_ptr = (pointer)this;
    lookupDownward(nameParts_02,*(NameComponents *)_Var6._M_extent_value,(ASTContext *)name,flags_00
                   ,this_01);
LAB_0032732e:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool lookupUpward(std::span<const NamePlusLoc> nameParts, const NameComponents& name,
                  const ASTContext& context, bitmask<LookupFlags> flags, LookupResult& result) {
    // Upward lookups can match either a scope name, or a module definition name (on any of the
    // instances). Imports are not considered.
    const Symbol* firstMatch = nullptr;
    auto tryMatch = [&](const Symbol& symbol) {
        // Keep track of the first match we find; if it turns out we can't
        // resolve all of the name parts we'll move on and try elsewhere,
        // but at the end if we couldn't find a full match we'll use this to
        // provide a better error.
        if (!firstMatch)
            firstMatch = &symbol;

        result.clear();
        result.found = &symbol;
        return lookupDownward(nameParts, name, context, flags, result);
    };

    uint32_t upwardCount = 0;
    const Scope* scope = context.scope;
    do {
        // Search for a scope or instance target within our current scope.
        auto symbol = scope->find(name.text);
        if (symbol && !symbol->isValue() && !symbol->isType() &&
            (symbol->isScope() || symbol->kind == SymbolKind::Instance)) {
            if (!tryMatch(*symbol))
                return false;

            if (result.found) {
                result.upwardCount = upwardCount;
                return true;
            }
        }

        // Advance to the next scope, skipping to the parent instance when
        // we hit an instance body instead of going on to the compilation unit.
        symbol = &scope->asSymbol();
        if (symbol->kind != SymbolKind::InstanceBody) {
            scope = symbol->getHierarchicalParent();
        }
        else {
            auto inst = symbol->as<InstanceBodySymbol>().parentInstance;
            SLANG_ASSERT(inst);

            // If the instance's definition name matches our target name,
            // try to match from the current instance.
            scope = inst->getParentScope();
            if (inst->getDefinition().name == name.text) {
                if (!tryMatch(*inst))
                    return false;

                if (result.found) {
                    result.upwardCount = upwardCount;
                    return true;
                }
            }
        }

        upwardCount++;
    } while (scope);

    result.clear();
    if (firstMatch) {
        // If we did find a match at some point, repeat that
        // lookup to provide a real error message.
        result.found = firstMatch;
        lookupDownward(nameParts, name, context, flags, result);
        return false;
    }
    return true;
}